

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop.cpp
# Opt level: O0

int __thiscall ncnn::UnaryOp::forward_inplace(UnaryOp *this,Mat *bottom_top_blob,Option *opt)

{
  Option *in_RSI;
  Mat *in_RDI;
  int local_4;
  
  if ((int)in_RDI[2].cstep == 0) {
    local_4 = unary_op_inplace<ncnn::unary_op_abs>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 1) {
    local_4 = unary_op_inplace<ncnn::unary_op_neg>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 2) {
    local_4 = unary_op_inplace<ncnn::unary_op_floor>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 3) {
    local_4 = unary_op_inplace<ncnn::unary_op_ceil>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 4) {
    local_4 = unary_op_inplace<ncnn::unary_op_square>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 5) {
    local_4 = unary_op_inplace<ncnn::unary_op_sqrt>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 6) {
    local_4 = unary_op_inplace<ncnn::unary_op_rsqrt>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 7) {
    local_4 = unary_op_inplace<ncnn::unary_op_exp>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 8) {
    local_4 = unary_op_inplace<ncnn::unary_op_log>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 9) {
    local_4 = unary_op_inplace<ncnn::unary_op_sin>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 10) {
    local_4 = unary_op_inplace<ncnn::unary_op_cos>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 0xb) {
    local_4 = unary_op_inplace<ncnn::unary_op_tan>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 0xc) {
    local_4 = unary_op_inplace<ncnn::unary_op_asin>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 0xd) {
    local_4 = unary_op_inplace<ncnn::unary_op_acos>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 0xe) {
    local_4 = unary_op_inplace<ncnn::unary_op_atan>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 0xf) {
    local_4 = unary_op_inplace<ncnn::unary_op_reciprocal>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 0x10) {
    local_4 = unary_op_inplace<ncnn::unary_op_tanh>(in_RDI,in_RSI);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int UnaryOp::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    return 0;
}